

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.h
# Opt level: O0

void __thiscall
Js::InterpreterStackFrame::
OP_CallIFlags<Js::OpLayoutT_CallIFlags<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_CallIFlags<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *playout)

{
  Var target;
  RecyclableObject *function;
  OpLayoutT_CallIFlags<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *playout_local;
  InterpreterStackFrame *this_local;
  
  target = GetRegAllowStackVar<unsigned_int>
                     (this,(playout->super_OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)2>_>
                           ).Function);
  function = OP_CallGetFunc(this,target);
  OP_CallCommon<Js::OpLayoutT_CallIFlags<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
            (this,playout,function,playout->callFlags,(AuxArray<unsigned_int> *)0x0);
  return;
}

Assistant:

void OP_CallI(const unaligned T* playout) { OP_CallCommon(playout, OP_CallGetFunc(GetRegAllowStackVar(playout->Function)), Js::CallFlags_None); }